

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

void __thiscall cmListFileParser::IssueError(cmListFileParser *this,string *text)

{
  cmListFileBacktrace lfbt;
  cmListFileBacktrace local_78;
  cmListFileContext lfc;
  
  lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
  lfc.Name._M_string_length = 0;
  lfc.Name.field_2._M_local_buf[0] = '\0';
  lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
  lfc.FilePath._M_string_length = 0;
  lfc.FilePath.field_2._M_local_buf[0] = '\0';
  lfc.Line = 0;
  std::__cxx11::string::assign((char *)&lfc.FilePath);
  lfc.Line = cmListFileLexer_GetCurrentLine(this->Lexer);
  cmListFileBacktrace::cmListFileBacktrace(&lfbt,&this->Backtrace);
  cmListFileBacktrace::Push(&local_78,&lfbt,&lfc);
  cmListFileBacktrace::operator=(&lfbt,&local_78);
  cmListFileBacktrace::~cmListFileBacktrace(&local_78);
  cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,text,&lfbt);
  cmSystemTools::s_FatalErrorOccured = true;
  cmListFileBacktrace::~cmListFileBacktrace(&lfbt);
  cmListFileContext::~cmListFileContext(&lfc);
  return;
}

Assistant:

void cmListFileParser::IssueError(const std::string& text) const
{
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = cmListFileLexer_GetCurrentLine(this->Lexer);
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  this->Messenger->IssueMessage(cmake::FATAL_ERROR, text, lfbt);
  cmSystemTools::SetFatalErrorOccured();
}